

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calibration.cpp
# Opt level: O0

void savePoints(int status,void *data)

{
  ostream *poVar1;
  int local_228;
  int i;
  ostream local_218 [8];
  ofstream output;
  void *data_local;
  int status_local;
  
  std::ofstream::ofstream(local_218,(string *)calibrationFile_abi_cxx11_,_S_out);
  poVar1 = std::operator<<((ostream *)&std::cout,"New points saved: \n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_228 = 0; local_228 < 4; local_228 = local_228 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(local_218,calibrationFirstArray[local_228].x);
    poVar1 = std::operator<<(poVar1,";");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,calibrationFirstArray[local_228].y);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,calibrationFirstArray[local_228].x);
    poVar1 = std::operator<<(poVar1,";");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,calibrationFirstArray[local_228].y);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::flush();
  std::ofstream::close();
  updateSize();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void savePoints(int status, void* data){
    ofstream output(calibrationFile);
    cout<<"New points saved: \n"<<endl;
    for(int i=0; i<4; i++) {
        output << calibrationFirstArray[i].x << ";" << calibrationFirstArray[i].y << endl;
        cout<< calibrationFirstArray[i].x << ";" << calibrationFirstArray[i].y << endl;
    }
    output.flush();
    output.close();

    updateSize();
}